

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O2

void __thiscall capnp::compiler::Compiler::Node::Node(Node *this,CompiledModule *module)

{
  Reader *__return_storage_ptr__;
  uint uVar1;
  void *pvVar2;
  int iVar3;
  uint32_t uVar4;
  uint64_t uVar5;
  undefined4 extraout_var;
  size_t in_RCX;
  size_t extraout_RDX;
  Which WVar6;
  Reader RVar7;
  StringPtr declName;
  Reader name;
  Reader local_58;
  
  (this->super_Resolver)._vptr_Resolver = (_func_int **)&PTR_resolve_00676640;
  this->module = module;
  (this->parent).ptr = (Node *)0x0;
  __return_storage_ptr__ = &this->declaration;
  capnp::_::OrphanGetImpl<capnp::compiler::ParsedFile,_(capnp::Kind)3>::applyReader
            (&local_58,&(module->content).builder);
  ParsedFile::Reader::getRoot(__return_storage_ptr__,&local_58);
  Declaration::Reader::getName((Reader *)&local_58,__return_storage_ptr__);
  RVar7 = LocatedText::Reader::getValue((Reader *)&local_58);
  declName.content.ptr = RVar7.super_StringPtr.content.size_;
  WVar6 = FILE;
  declName.content.size_ = in_RCX;
  uVar5 = generateId((Node *)0x0,(uint64_t)RVar7.super_StringPtr.content.ptr,declName,
                     (Reader)(this->declaration)._reader);
  this->id = uVar5;
  iVar3 = (*(module->parserModule->super_ErrorReporter)._vptr_ErrorReporter[2])();
  (this->displayName).content.ptr = (char *)CONCAT44(extraout_var,iVar3);
  (this->displayName).content.size_ = extraout_RDX;
  if (0x1f < (this->declaration)._reader.dataSize) {
    WVar6 = *(Which *)((long)(this->declaration)._reader.data + 2);
  }
  this->kind = WVar6;
  Declaration::Reader::getParameters((Reader *)&local_58,__return_storage_ptr__);
  this->genericParamCount = (uint)local_58._reader.pointers;
  this->isBuiltin = false;
  Content::Content(&this->guardedContent);
  this->inGetContent = false;
  (this->loadedFinalSchema).ptr.isSet = false;
  Declaration::Reader::getName((Reader *)&local_58,__return_storage_ptr__);
  RVar7 = LocatedText::Reader::getValue((Reader *)&local_58);
  if (RVar7.super_StringPtr.content.size_ == 1) {
    uVar1 = (this->declaration)._reader.dataSize;
    if (uVar1 < 0x40) {
LAB_00474fbc:
      this->startByte = 0;
    }
    else {
      pvVar2 = (this->declaration)._reader.data;
      this->startByte = *(uint32_t *)((long)pvVar2 + 4);
      if (0x5f < uVar1) {
        uVar4 = *(uint32_t *)((long)pvVar2 + 8);
        goto LAB_00474fc2;
      }
    }
  }
  else {
    if (local_58._reader.dataSize < 0x20) goto LAB_00474fbc;
    this->startByte = *local_58._reader.data;
    if (0x3f < local_58._reader.dataSize) {
      uVar4 = *(uint32_t *)((long)local_58._reader.data + 4);
      goto LAB_00474fc2;
    }
  }
  uVar4 = 0;
LAB_00474fc2:
  this->endByte = uVar4;
  uVar5 = Compiler::Impl::addNode(module->compiler,this->id,this);
  this->id = uVar5;
  return;
}

Assistant:

Compiler::Node::Node(CompiledModule& module)
    : module(&module),
      parent(nullptr),
      declaration(module.getParsedFile().getRoot()),
      id(generateId(0, declaration.getName().getValue(), declaration.getId())),
      displayName(module.getSourceName()),
      kind(declaration.which()),
      genericParamCount(declaration.getParameters().size()),
      isBuiltin(false) {
  auto name = declaration.getName();
  if (name.getValue().size() > 0) {
    startByte = name.getStartByte();
    endByte = name.getEndByte();
  } else {
    startByte = declaration.getStartByte();
    endByte = declaration.getEndByte();
  }

  id = module.getCompiler().addNode(id, *this);
}